

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O0

ErrorStackOption * __thiscall
ritobin::io::json_impl::json_value_impl<ritobin::Pointer,_(ritobin::Category)8>::from_json
          (ErrorStackOption *__return_storage_ptr__,
          json_value_impl<ritobin::Pointer,_(ritobin::Category)8> *this,Pointer *value,json *json)

{
  json *value_00;
  bool bVar1;
  const_reference pvVar2;
  ErrorStack *this_00;
  size_t index_00;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  byte local_179;
  reference local_178;
  value_type *value_item;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *json_item;
  const_iterator __end3;
  const_iterator __begin3;
  value_type *__range3;
  size_t index;
  value_type *json_items;
  char *local_108;
  string asStack_100 [32];
  undefined1 local_e0 [48];
  undefined1 local_b0 [48];
  undefined1 local_80 [48];
  undefined1 local_50 [48];
  Pointer *local_20;
  json *json_local;
  Pointer *value_local;
  ErrorStackOption *error;
  
  local_20 = value;
  json_local = (json *)this;
  value_local = (Pointer *)__return_storage_ptr__;
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::is_object((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)value);
  if (bVar1) {
    bVar1 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::contains<const_char_(&)[5],_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_20,(char (*) [5])0x1d03d9);
    if (bVar1) {
      bVar1 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::contains<const_char_(&)[6],_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)local_20,(char (*) [6])"items");
      value_00 = json_local;
      if (bVar1) {
        pvVar2 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)local_20,"name");
        bVar1 = hash_from_json<ritobin::FNV1a>((FNV1a *)value_00,pvVar2);
        if (bVar1) {
          pvVar2 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)local_20,"items");
          bVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::is_array(pvVar2);
          if (bVar1) {
            pvVar2 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                 *)local_20,"items");
            __range3 = (value_type *)0x0;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::begin((const_iterator *)&__end3.m_it.primitive_iterator,pvVar2);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::end((const_iterator *)&json_item,pvVar2);
            while (bVar1 = nlohmann::detail::
                           iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ::operator!=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                         *)&__end3.m_it.primitive_iterator,
                                        (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                         *)&json_item), bVar1) {
              value_item = (value_type *)
                           nlohmann::detail::
                           iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        *)&__end3.m_it.primitive_iterator);
              local_178 = std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>::
                          emplace_back<>((vector<ritobin::Field,_std::allocator<ritobin::Field>_> *)
                                         &json_local[2].m_value);
              local_179 = 0;
              item_from_json(__return_storage_ptr__,(json_impl *)local_178,value_item,json);
              bVar1 = std::optional::operator_cast_to_bool((optional *)__return_storage_ptr__);
              if (bVar1) {
                this_00 = std::optional<ritobin::io::json_impl::ErrorStack>::operator->
                                    (__return_storage_ptr__);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1e0,"items",&local_1e1);
                to_index(&local_1c0,&local_1e0);
                to_index_abi_cxx11_(&local_208,(json_impl *)__range3,index_00);
                std::operator+(&local_1a0,&local_1c0,&local_208);
                ErrorStack::push(this_00,&local_1a0);
                std::__cxx11::string::~string((string *)&local_1a0);
                std::__cxx11::string::~string((string *)&local_208);
                std::__cxx11::string::~string((string *)&local_1c0);
                std::__cxx11::string::~string((string *)&local_1e0);
                std::allocator<char>::~allocator(&local_1e1);
                local_179 = 1;
              }
              if ((local_179 & 1) == 0) {
                std::optional<ritobin::io::json_impl::ErrorStack>::~optional(__return_storage_ptr__)
                ;
              }
              if (bVar1) {
                return __return_storage_ptr__;
              }
              __range3 = (value_type *)&__range3->field_0x1;
              nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator++((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)&__end3.m_it.primitive_iterator);
            }
            std::optional<ritobin::io::json_impl::ErrorStack>::optional(__return_storage_ptr__);
          }
          else {
            json_items = (value_type *)Pointer::type_name;
            local_108 = "json[\"items\"].is_array()";
            std::__cxx11::string::string(asStack_100);
            std::optional<ritobin::io::json_impl::ErrorStack>::
            optional<ritobin::io::json_impl::ErrorStack,_true>
                      (__return_storage_ptr__,(ErrorStack *)&json_items);
            ErrorStack::~ErrorStack((ErrorStack *)&json_items);
          }
        }
        else {
          local_e0._0_8_ = "pointer";
          local_e0._8_8_ = "hash_from_json(value.name, json[\"name\"])";
          std::__cxx11::string::string((string *)(local_e0 + 0x10));
          std::optional<ritobin::io::json_impl::ErrorStack>::
          optional<ritobin::io::json_impl::ErrorStack,_true>
                    (__return_storage_ptr__,(ErrorStack *)local_e0);
          ErrorStack::~ErrorStack((ErrorStack *)local_e0);
        }
      }
      else {
        local_b0._0_8_ = "pointer";
        local_b0._8_8_ = "json.contains(\"items\")";
        std::__cxx11::string::string((string *)(local_b0 + 0x10));
        std::optional<ritobin::io::json_impl::ErrorStack>::
        optional<ritobin::io::json_impl::ErrorStack,_true>
                  (__return_storage_ptr__,(ErrorStack *)local_b0);
        ErrorStack::~ErrorStack((ErrorStack *)local_b0);
      }
    }
    else {
      local_80._0_8_ = "pointer";
      local_80._8_8_ = "json.contains(\"name\")";
      std::__cxx11::string::string((string *)(local_80 + 0x10));
      std::optional<ritobin::io::json_impl::ErrorStack>::
      optional<ritobin::io::json_impl::ErrorStack,_true>
                (__return_storage_ptr__,(ErrorStack *)local_80);
      ErrorStack::~ErrorStack((ErrorStack *)local_80);
    }
  }
  else {
    local_50._0_8_ = "pointer";
    local_50._8_8_ = "json.is_object()";
    std::__cxx11::string::string((string *)(local_50 + 0x10));
    std::optional<ritobin::io::json_impl::ErrorStack>::
    optional<ritobin::io::json_impl::ErrorStack,_true>
              (__return_storage_ptr__,(ErrorStack *)local_50);
    ErrorStack::~ErrorStack((ErrorStack *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

static ErrorStackOption from_json(T& value, json const& json) noexcept {
            bin_json_assert(json.is_object());
            bin_json_assert(json.contains("name"));
            bin_json_assert(json.contains("items"));
            bin_json_assert(hash_from_json(value.name, json["name"]));
            bin_json_assert(json["items"].is_array());
            auto const& json_items = json["items"];
            size_t index = 0;
            for (auto const& json_item: json_items) {
                auto& value_item = value.items.emplace_back();
                bin_json_rethrow(to_index("items") + to_index(index),
                                 item_from_json(value_item, json_item));
                ++index;
            }
            return std::nullopt;
        }